

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty.cpp
# Opt level: O2

string * __thiscall
cli::getPrettyCompression_abi_cxx11_
          (string *__return_storage_ptr__,cli *this,Compression compression)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((int)this == 1) {
    __s = "LZ4";
    __a = &local_a;
  }
  else if ((int)this == 0) {
    __s = "None";
    __a = &local_9;
  }
  else {
    __s = "Unknown";
    __a = &local_b;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string getPrettyCompression(ZAP::Compression compression)
	{
		switch (compression)
		{
		case ZAP::Compression::NONE: return "None";
		case ZAP::Compression::LZ4:  return "LZ4";
		default: return "Unknown";
		}
	}